

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall LowererMDArch::GenerateStackAllocation(LowererMDArch *this,Instr *instr,uint32 size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  IntConstOpnd *src2Opnd;
  Instr *pIVar4;
  RegOpnd *dstOpnd_00;
  RegOpnd *src1Opnd;
  HelperCallOpnd *src1Opnd_00;
  Instr *movHelperAddrInstr;
  Instr *callInstr;
  Instr *subInstr_1;
  RegOpnd *rcxOpnd;
  RegOpnd *raxOpnd;
  Instr *subInstr;
  IntConstOpnd *stackSizeOpnd;
  RegOpnd *rspOpnd;
  uint32 size_local;
  Instr *instr_local;
  LowererMDArch *this_local;
  
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x5db,"(size > 0)","size > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  dstOpnd = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  src2Opnd = IR::IntConstOpnd::New((ulong)size,TyInt64,this->m_func,false);
  if (size < 0x2001) {
    pIVar4 = IR::Instr::New(SUB,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&src2Opnd->super_Opnd,
                            this->m_func);
    IR::Instr::InsertAfter(instr,pIVar4);
  }
  else {
    dstOpnd_00 = IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyInt64,this->m_func);
    src1Opnd = IR::RegOpnd::New((StackSym *)0x0,RegArg3,TyInt64,this->m_func);
    pIVar4 = IR::Instr::New(SUB,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&src2Opnd->super_Opnd,
                            this->m_func);
    IR::Instr::InsertAfter(instr,pIVar4);
    pIVar4 = IR::Instr::New(Call,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertAfter(instr,pIVar4);
    LowerCall(this,pIVar4,0);
    src1Opnd_00 = IR::HelperCallOpnd::New(HelperCRT_chkstk,this->m_func);
    pIVar4 = IR::Instr::New(MOV,&src1Opnd->super_Opnd,&src1Opnd_00->super_Opnd,this->m_func);
    IR::Instr::InsertAfter(instr,pIVar4);
    Lowerer::InsertMove(&dstOpnd_00->super_Opnd,&src2Opnd->super_Opnd,instr->m_next,true);
  }
  return;
}

Assistant:

void
LowererMDArch::GenerateStackAllocation(IR::Instr *instr, uint32 size)
{
    Assert(size > 0);

    IR::RegOpnd *       rspOpnd         = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);

    //review: size should fit in 32bits

    IR::IntConstOpnd *  stackSizeOpnd   = IR::IntConstOpnd::New(size, TyMachReg, this->m_func);

    if (size <= PAGESIZE)
    {
        // Generate SUB RSP, stackSize

        IR::Instr * subInstr = IR::Instr::New(Js::OpCode::SUB,
            rspOpnd, rspOpnd, stackSizeOpnd, this->m_func);

        instr->InsertAfter(subInstr);
    }
    else
    {
        // Generate _chkstk call

        //
        // REVIEW: Call to helper functions assume the address of the variable to be present in
        // RAX. But _chkstk method accepts argument in RAX. Hence handling this one manually.
        // fix this later when CALLHELPER leaved dependency on RAX.
        //

        IR::RegOpnd *raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyMachReg, this->m_func);
        IR::RegOpnd *rcxOpnd = IR::RegOpnd::New(nullptr, RegRCX, TyMachReg, this->m_func);

        IR::Instr * subInstr = IR::Instr::New(Js::OpCode::SUB, rspOpnd, rspOpnd, stackSizeOpnd, this->m_func);
        instr->InsertAfter(subInstr);

        // Leave off the src until we've calculated it below.
        IR::Instr * callInstr = IR::Instr::New(Js::OpCode::Call, raxOpnd, rcxOpnd, this->m_func);
        instr->InsertAfter(callInstr);

        this->LowerCall(callInstr, 0);

        {
            IR::Instr   *movHelperAddrInstr = IR::Instr::New(
                Js::OpCode::MOV,
                rcxOpnd,
                IR::HelperCallOpnd::New(IR::HelperCRT_chkstk, this->m_func),
                this->m_func);

            instr->InsertAfter(movHelperAddrInstr);
        }

        Lowerer::InsertMove(raxOpnd, stackSizeOpnd, instr->m_next);
    }
}